

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O3

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,InstanceSymbol *symbol)

{
  unsigned_long *puVar1;
  Diagnostic *pDVar2;
  Definition *this_00;
  long lVar3;
  pair<ska::detailv3::sherwood_v3_table<std::pair<const_slang::ast::Definition_*,_unsigned_long>,_const_slang::ast::Definition_*,_slang::Hasher<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueHasher<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_unsigned_long>,_slang::Hasher<const_slang::ast::Definition_*>_>,_std::equal_to<const_slang::ast::Definition_*>,_ska::detailv3::KeyOrValueEquality<const_slang::ast::Definition_*,_std::pair<const_slang::ast::Definition_*,_unsigned_long>,_std::equal_to<const_slang::ast::Definition_*>_>,_std::allocator<std::pair<const_slang::ast::Definition_*,_unsigned_long>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::ast::Definition_*,_unsigned_long>_>_>_>::templated_iterator<std::pair<const_slang::ast::Definition_*,_unsigned_long>_>,_bool>
  pVar4;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar5;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>::templated_iterator<const_slang::ast::InstanceBodySymbol_*>,_bool>
  pVar6;
  string_view sVar7;
  function_ref<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  detail;
  function_ref<void_(const_slang::ast::PortConnection_&)> cb;
  TimeTraceScope timeScope;
  TimeTraceScope local_49;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_ast_ElabVisitors_h:269:33)>
  local_48;
  ulong local_30;
  
  if ((*this->numErrors <= (ulong)this->errorLimit) && (this->hierarchyProblem == false)) {
    local_48.func.this = (DiagnosticVisitor *)symbol;
    if (TimeTrace::profiler != 0) {
      detail.callable = (intptr_t)&local_48;
      detail.callback =
           function_ref<std::__cxx11::string()>::
           callback_fn<slang::ast::DiagnosticVisitor::handle(slang::ast::InstanceSymbol_const&)::_lambda()_1_>
      ;
      sVar7._M_str = "AST Instance";
      sVar7._M_len = 0xc;
      TimeTrace::beginTrace(sVar7,detail);
    }
    local_48.func.this = (DiagnosticVisitor *)InstanceSymbol::getDefinition(symbol);
    pVar4 = ska::detailv3::
            sherwood_v3_table<std::pair<slang::ast::Definition_const*,unsigned_long>,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Definition_const*,std::pair<slang::ast::Definition_const*,unsigned_long>,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Definition_const*,std::pair<slang::ast::Definition_const*,unsigned_long>,std::equal_to<slang::ast::Definition_const*>>,std::allocator<std::pair<slang::ast::Definition_const*,unsigned_long>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Definition_const*,unsigned_long>>>>
            ::
            emplace<slang::ast::Definition_const*,ska::flat_hash_map<slang::ast::Definition_const*,unsigned_long,slang::Hasher<slang::ast::Definition_const*>,std::equal_to<slang::ast::Definition_const*>,std::allocator<std::pair<slang::ast::Definition_const*,unsigned_long>>>::convertible_to_value>
                      ((sherwood_v3_table<std::pair<slang::ast::Definition_const*,unsigned_long>,slang::ast::Definition_const*,slang::Hasher<slang::ast::Definition_const*>,ska::detailv3::KeyOrValueHasher<slang::ast::Definition_const*,std::pair<slang::ast::Definition_const*,unsigned_long>,slang::Hasher<slang::ast::Definition_const*>>,std::equal_to<slang::ast::Definition_const*>,ska::detailv3::KeyOrValueEquality<slang::ast::Definition_const*,std::pair<slang::ast::Definition_const*,unsigned_long>,std::equal_to<slang::ast::Definition_const*>>,std::allocator<std::pair<slang::ast::Definition_const*,unsigned_long>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::ast::Definition_const*,unsigned_long>>>>
                        *)&this->instanceCount,(Definition **)&local_48,
                       (convertible_to_value *)&local_30);
    puVar1 = &((pVar4.first.current.current)->field_1).value.second;
    *puVar1 = *puVar1 + 1;
    sVar5 = Compilation::getAttributes(this->compilation,symbol);
    if (sVar5.size_ != 0) {
      lVar3 = 0;
      do {
        AttributeSymbol::getValue(*(AttributeSymbol **)((long)sVar5.data_ + lVar3));
        lVar3 = lVar3 + 8;
      } while (sVar5.size_ << 3 != lVar3);
    }
    cb.callable = (intptr_t)&local_48;
    cb.callback = function_ref<void(slang::ast::PortConnection_const&)>::
                  callback_fn<slang::ast::DiagnosticVisitor::handle(slang::ast::InstanceSymbol_const&)::_lambda(auto:1&)_1_>
    ;
    local_48.func.this = this;
    InstanceSymbol::forEachPortConnection(symbol,cb);
    local_48.func.this = (DiagnosticVisitor *)symbol->body;
    pVar6 = ska::detailv3::
            sherwood_v3_table<slang::ast::InstanceBodySymbol_const*,slang::ast::InstanceBodySymbol_const*,slang::Hasher<slang::ast::InstanceBodySymbol_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::InstanceBodySymbol_const*>>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::InstanceBodySymbol_const*>>,std::allocator<slang::ast::InstanceBodySymbol_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::InstanceBodySymbol_const*>>>
            ::emplace<slang::ast::InstanceBodySymbol_const*>
                      ((sherwood_v3_table<slang::ast::InstanceBodySymbol_const*,slang::ast::InstanceBodySymbol_const*,slang::Hasher<slang::ast::InstanceBodySymbol_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::InstanceBodySymbol_const*>>,std::equal_to<slang::ast::InstanceBodySymbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::InstanceBodySymbol_const*>>,std::allocator<slang::ast::InstanceBodySymbol_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::InstanceBodySymbol_const*>>>
                        *)&this->activeInstanceBodies,(InstanceBodySymbol **)&local_48);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pDVar2 = Scope::addDiag((symbol->super_InstanceSymbolBase).super_Symbol.parentScope,
                              (DiagCode)0x8000d,
                              (symbol->super_InstanceSymbolBase).super_Symbol.location);
      Diagnostic::operator<<(pDVar2,(symbol->super_InstanceSymbolBase).super_Symbol.name);
      this->hierarchyProblem = true;
    }
    else {
      local_48.valid = true;
      local_48.func.symbol = symbol;
      if ((ulong)(this->compilation->options).maxInstanceDepth <
          (this->activeInstanceBodies).
          super_sherwood_v3_table<const_slang::ast::InstanceBodySymbol_*,_const_slang::ast::InstanceBodySymbol_*,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::InstanceBodySymbol_*>_>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>_>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::InstanceBodySymbol_*>_>_>
          .num_elements) {
        local_48.func.this = this;
        pDVar2 = Scope::addDiag((symbol->super_InstanceSymbolBase).super_Symbol.parentScope,
                                (DiagCode)0xc000d,
                                (symbol->super_InstanceSymbolBase).super_Symbol.location);
        this_00 = InstanceSymbol::getDefinition(symbol);
        sVar7 = Definition::getKindString(this_00);
        Diagnostic::operator<<(pDVar2,sVar7);
        local_30 = (ulong)(this->compilation->options).maxInstanceDepth;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
        ::emplace_back<unsigned_long>(&pDVar2->args,&local_30);
        this->hierarchyProblem = true;
      }
      else {
        local_48.func.this = this;
        handleDefault<slang::ast::InstanceBodySymbol>(this,symbol->body);
      }
      ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/ElabVisitors.h:269:33)>
      ::~ScopeGuard(&local_48);
    }
    TimeTraceScope::~TimeTraceScope(&local_49);
  }
  return;
}

Assistant:

void handle(const InstanceSymbol& symbol) {
        if (numErrors > errorLimit || hierarchyProblem)
            return;

        TimeTraceScope timeScope("AST Instance", [&] {
            std::string buffer;
            symbol.getHierarchicalPath(buffer);
            return buffer;
        });

        instanceCount[&symbol.getDefinition()]++;

        for (auto attr : compilation.getAttributes(symbol))
            attr->getValue();

        symbol.forEachPortConnection([&](auto& conn) {
            conn.getExpression();
            conn.checkSimulatedNetTypes();
            for (auto attr : compilation.getAttributes(conn))
                attr->getValue();
        });

        // Detect infinite recursion, which happens if we see this exact
        // instance body somewhere higher up in the stack.
        if (!activeInstanceBodies.emplace(&symbol.body).second) {
            symbol.getParentScope()->addDiag(diag::InfinitelyRecursiveHierarchy, symbol.location)
                << symbol.name;
            hierarchyProblem = true;
            return;
        }

        // In order to avoid "effectively infinite" recursions, where parameter values
        // are changing but the numbers are so huge that we would run for almost forever,
        // check the depth and bail out after a certain configurable point.
        auto guard = ScopeGuard([this, &symbol] { activeInstanceBodies.erase(&symbol.body); });
        if (activeInstanceBodies.size() > compilation.getOptions().maxInstanceDepth) {
            auto& diag = symbol.getParentScope()->addDiag(diag::MaxInstanceDepthExceeded,
                                                          symbol.location);
            diag << symbol.getDefinition().getKindString();
            diag << compilation.getOptions().maxInstanceDepth;
            hierarchyProblem = true;
            return;
        }

        visit(symbol.body);
    }